

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLedgerEntry.cpp
# Opt level: O2

string * __thiscall
jbcoin::STLedgerEntry::getFullText_abi_cxx11_(string *__return_storage_ptr__,STLedgerEntry *this)

{
  Item *pIVar1;
  base_uint<256UL,_void> *a;
  string sStack_38;
  
  LedgerFormats::getInstance();
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::findByType
                     (&LedgerFormats::getInstance::instance.
                       super_KnownFormats<jbcoin::LedgerEntryType>,this->type_);
  if (pIVar1 != (Item *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"\"",(allocator *)&sStack_38);
    to_string<256ul,void>(&sStack_38,(jbcoin *)&this->key_,a);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_38);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    STObject::getFullText_abi_cxx11_(&sStack_38,&this->super_STObject);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_38);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  Throw<std::runtime_error,char_const(&)[26]>((char (*) [26])"invalid ledger entry type");
}

Assistant:

std::string STLedgerEntry::getFullText () const
{
    auto const format =
        LedgerFormats::getInstance().findByType (type_);

    if (format == nullptr)
        Throw<std::runtime_error> ("invalid ledger entry type");

    std::string ret = "\"";
    ret += to_string (key_);
    ret += "\" = { ";
    ret += format->getName ();
    ret += ", ";
    ret += STObject::getFullText ();
    ret += "}";
    return ret;
}